

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bitwidth_t __thiscall slang::SVInt::countLeadingOnesSlowCase(SVInt *this)

{
  uint32_t uVar1;
  _If_is_unsigned_integer<unsigned_long,_int> _Var2;
  long *in_RDI;
  bitwidth_t count;
  int i;
  uint32_t shift;
  bitwidth_t bitsInMsw;
  uint local_18;
  int local_14;
  uint local_c;
  
  local_c = *(uint *)(in_RDI + 1) & 0x3f;
  if (local_c == 0) {
    local_c = 0x40;
  }
  uVar1 = getNumWords((SVInt *)0x2a270d);
  local_18 = std::countl_one<unsigned_long>(0x2a2735);
  if (local_18 == local_c) {
    for (local_14 = uVar1 - 2; -1 < local_14; local_14 = local_14 + -1) {
      if (*(long *)(*in_RDI + (long)local_14 * 8) != -1) {
        _Var2 = std::countl_one<unsigned_long>(0x2a278c);
        return _Var2 + local_18;
      }
      local_18 = local_18 + 0x40;
    }
  }
  return local_18;
}

Assistant:

bitwidth_t SVInt::countLeadingOnesSlowCase() const {
    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int i = int(getNumWords() - 1);
    bitwidth_t count = (bitwidth_t)std::countl_one(pVal[i] << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            if (pVal[i] == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(pVal[i]);
                break;
            }
        }
    }

    return count;
}